

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatasetBuilder.cpp
# Opt level: O0

FileId __thiscall DatasetBuilder::register_fname(DatasetBuilder *this,string *fname)

{
  FileId FVar1;
  long lVar2;
  runtime_error *this_00;
  size_type sVar3;
  char in_SIL;
  value_type *in_RDI;
  FileId new_id;
  undefined4 in_stack_ffffffffffffffe4;
  
  lVar2 = std::__cxx11::string::find(in_SIL,10);
  if (lVar2 == -1) {
    lVar2 = std::__cxx11::string::find(in_SIL,0xd);
    if (lVar2 == -1) {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 1));
      FVar1 = (FileId)sVar3;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffffe4,FVar1),in_RDI);
      return FVar1;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"file name contains invalid character (either \\r or \\n)");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

FileId DatasetBuilder::register_fname(const std::string &fname) {
    if (fname.find('\n') != std::string::npos ||
        fname.find('\r') != std::string::npos) {
        throw std::runtime_error(
            "file name contains invalid character (either \\r or \\n)");
    }

    auto new_id = static_cast<FileId>(fids.size());
    fids.push_back(fname);
    return new_id;
}